

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scriptoperator.cpp
# Opt level: O2

void __thiscall
ScriptOperator_operator_5_Test::ScriptOperator_operator_5_Test(ScriptOperator_operator_5_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_005c3528;
  return;
}

Assistant:

TEST(ScriptOperator, operator_5) {
  ScriptOperator script_op(ScriptOperator::OP_12);
  EXPECT_FALSE(script_op <= ScriptOperator::OP_RESERVED);
  EXPECT_FALSE(script_op <= ScriptOperator::OP_1);
  EXPECT_TRUE(script_op <= ScriptOperator::OP_12);
  EXPECT_TRUE(script_op <= ScriptOperator::OP_LEFT);
  EXPECT_STREQ(script_op.ToString().c_str(), "12");
  EXPECT_STREQ(script_op.ToCodeString().c_str(), "OP_12");
  EXPECT_TRUE(script_op.IsPushOperator());
}